

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int fts3StringAppend(StrBuffer *pStr,char *zAppend,int nAppend)

{
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  long lVar4;
  u64 nBytes;
  
  if (nAppend < 0) {
    sVar2 = strlen(zAppend);
    nAppend = (int)sVar2;
  }
  sVar2 = (size_t)nAppend;
  if (pStr->nAlloc <= nAppend + pStr->n + 1) {
    nBytes = sVar2 + (long)pStr->nAlloc + 100;
    pcVar3 = pStr->z;
    iVar1 = sqlite3_initialize();
    if (iVar1 == 0) {
      pcVar3 = (char *)sqlite3Realloc(pcVar3,nBytes);
    }
    else {
      pcVar3 = (char *)0x0;
    }
    if (pcVar3 == (char *)0x0) {
      return 7;
    }
    pStr->z = pcVar3;
    pStr->nAlloc = (int)nBytes;
  }
  memcpy(pStr->z + pStr->n,zAppend,sVar2);
  lVar4 = (long)pStr->n + sVar2;
  pStr->n = (int)lVar4;
  pStr->z[lVar4] = '\0';
  return 0;
}

Assistant:

static int fts3StringAppend(
  StrBuffer *pStr,                /* Buffer to append to */
  const char *zAppend,            /* Pointer to data to append to buffer */
  int nAppend                     /* Size of zAppend in bytes (or -1) */
){
  if( nAppend<0 ){
    nAppend = (int)strlen(zAppend);
  }

  /* If there is insufficient space allocated at StrBuffer.z, use realloc()
  ** to grow the buffer until so that it is big enough to accomadate the
  ** appended data.
  */
  if( pStr->n+nAppend+1>=pStr->nAlloc ){
    sqlite3_int64 nAlloc = pStr->nAlloc+(sqlite3_int64)nAppend+100;
    char *zNew = sqlite3_realloc64(pStr->z, nAlloc);
    if( !zNew ){
      return SQLITE_NOMEM;
    }
    pStr->z = zNew;
    pStr->nAlloc = nAlloc;
  }
  assert( pStr->z!=0 && (pStr->nAlloc >= pStr->n+nAppend+1) );

  /* Append the data to the string buffer. */
  memcpy(&pStr->z[pStr->n], zAppend, nAppend);
  pStr->n += nAppend;
  pStr->z[pStr->n] = '\0';

  return SQLITE_OK;
}